

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

vector_t * vector_create(void)

{
  vector_t *pvVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)0x18;
  pvVar1 = (vector_t *)malloc(0x18);
  if (pvVar1 == (vector_t *)0x0) {
    vector_create_cold_2();
  }
  else {
    pvVar1->capacity = 0x80;
    pvVar1->size = 0;
    puVar3 = (undefined8 *)0x400;
    psVar2 = (size_t *)malloc(0x400);
    pvVar1->values = psVar2;
    if (psVar2 != (size_t *)0x0) {
      return pvVar1;
    }
  }
  vector_create_cold_1();
  return (vector_t *)*puVar3;
}

Assistant:

struct vector_t* vector_create()
{
  struct vector_t *vec = malloc(sizeof(struct vector_t));
  if (vec == NULL)
    VECTOR_FATAL_ERROR("Failed to allocate memory for vector\n");

  vec->capacity = VECTOR_INITIAL_CAPACITY;
  vec->size = 0;
  vec->values = malloc(sizeof(*vec->values) * vec->capacity);
  if (vec->values == NULL)
    VECTOR_FATAL_ERROR("Failed to allocate memory for vector values\n");
  return vec;
}